

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlEncInputChunk(xmlCharEncodingHandler *handler,uchar *out,int *outlen,uchar *in,int *inlen)

{
  uint uVar1;
  
  if (handler->input != (xmlCharEncodingInputFunc)0x0) {
    uVar1 = (*handler->input)(out,outlen,in,inlen);
    return uVar1 & (int)uVar1 >> 0x1f;
  }
  *outlen = 0;
  *inlen = 0;
  return -1;
}

Assistant:

int
xmlEncInputChunk(xmlCharEncodingHandler *handler, unsigned char *out,
                 int *outlen, const unsigned char *in, int *inlen) {
    int ret;

    if (handler->input != NULL) {
        xmlCharEncConvFunc conv =
            (xmlCharEncConvFunc) (void (*)(void)) handler->input;

        ret = conv(out, outlen, in, inlen, handler->inputCtxt);
        if (ret > 0)
            ret = XML_ENC_ERR_SUCCESS;
    }
    else {
        *outlen = 0;
        *inlen = 0;
        ret = XML_ENC_ERR_INTERNAL;
    }

    return(ret);
}